

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::set<short,_1UL,_std::less<short>_>::find<int>
          (set<short,_1UL,_std::less<short>_> *this,int *key)

{
  bool bVar1;
  set<short,_1UL,_std::less<short>_> *psVar2;
  set<short,_1UL,_std::less<short>_> *psVar3;
  key_compare *this_00;
  byte local_2b;
  short local_2a;
  set<short,_1UL,_std::less<short>_> *local_28;
  const_iterator where;
  int *key_local;
  set<short,_1UL,_std::less<short>_> *this_local;
  
  where = (const_iterator)key;
  key_local = (int *)this;
  psVar2 = (set<short,_1UL,_std::less<short>_> *)lower_bound<int>(this,key);
  local_28 = psVar2;
  psVar3 = (set<short,_1UL,_std::less<short>_> *)end(this);
  local_2b = 0;
  if (psVar2 != psVar3) {
    this_00 = value_comp(this);
    local_2a = (short)*(undefined4 *)where;
    bVar1 = std::less<short>::operator()(this_00,&local_2a,(short *)local_28);
    local_2b = bVar1 ^ 0xff;
  }
  if ((local_2b & 1) == 0) {
    this_local = (set<short,_1UL,_std::less<short>_> *)end(this);
  }
  else {
    this_local = local_28;
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }